

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O1

void __thiscall OS_HttpPayloadItem::~OS_HttpPayloadItem(OS_HttpPayloadItem *this)

{
  lib_free_str(this->name);
  lib_free_str(this->val);
  lib_free_str(this->mime_type);
  if (this->stream != (CVmDataSource *)0x0) {
    (*this->stream->_vptr_CVmDataSource[1])();
    return;
  }
  return;
}

Assistant:

OS_HttpPayloadItem::~OS_HttpPayloadItem()
{
    lib_free_str(name);
    lib_free_str(val);
    lib_free_str(mime_type);
    if (stream != 0)
        delete stream;
}